

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab::normalize_ndf(tab *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  vec2 vVar8;
  float fVar9;
  vec2 local_20;
  vec3 local_18;
  
  local_20.x = 1.0;
  local_20.y = 1.0;
  local_18.x = 0.0;
  local_18.y = 0.0;
  local_18.z = 1.0;
  vVar8 = cdfv(this,&local_20,&local_18);
  if (vVar8.x <= 0.0) {
    __assert_fail("cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && \"Invalid NDF normalization\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x850,"void djb::tab::normalize_ndf()");
  }
  local_20.x = 1.0;
  local_20.y = 1.0;
  local_18.x = 0.0;
  local_18.y = 0.0;
  local_18.z = 1.0;
  vVar8 = cdfv(this,&local_20,&local_18);
  fVar9 = 1.0 / vVar8.x;
  pfVar1 = (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->m_ndf).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (lVar6 = 0; lVar6 < (int)((ulong)((long)pfVar2 - (long)pfVar1) >> 2); lVar6 = lVar6 + 1) {
    pfVar1[lVar6] = pfVar1[lVar6] * fVar9;
  }
  pvVar3 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) >> 3;
  uVar7 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar7;
  }
  for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
    vVar8.x = pvVar3[uVar7].x * fVar9;
    vVar8.y = pvVar3[uVar7].y * fVar9;
    pvVar3[uVar7] = vVar8;
  }
  fprintf(_stdout,"djb_verbose: NDF norm. constant = %.9f\n",(double)fVar9);
  return;
}

Assistant:

void tab::normalize_ndf()
{
	DJB_ASSERT(cdf(vec2(1, 1), vec3(0, 0, 1)) > 0 && "Invalid NDF normalization");
	float_t nrm = 1 / cdf(vec2(1, 1), vec3(0, 0, 1));

	for (int i = 0; i < (int)m_ndf.size(); ++i)
		m_ndf[i]*= nrm;

	for (int i = 0; i < (int)m_cdf.size(); ++i)
		m_cdf[i]*= nrm;

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF norm. constant = %.9f\n", (double)nrm);
#endif
}